

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Ssw_SecCexResimulate(Aig_Man_t *p,int *pModel,int *pnOutputs)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int local_30;
  int local_2c;
  int RetValue;
  int i;
  Aig_Obj_t *pObj;
  int *pnOutputs_local;
  int *pModel_local;
  Aig_Man_t *p_local;
  
  local_30 = -1;
  *pnOutputs = 0;
  pAVar6 = Aig_ManConst1(p);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vCis), local_2c < iVar3; local_2c = local_2c + 1) {
    pvVar7 = Vec_PtrEntry(p->vCis,local_2c);
    *(ulong *)((long)pvVar7 + 0x18) =
         *(ulong *)((long)pvVar7 + 0x18) & 0xffffffffffffffef |
         ((ulong)(uint)pModel[local_2c] & 1) << 4;
  }
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vObjs), local_2c < iVar3; local_2c = local_2c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      pAVar8 = Aig_ObjFanin0(pAVar6);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar6);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      uVar1 = *(ulong *)&pAVar8->field_0x18;
      uVar4 = Aig_ObjFaninC1(pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef |
           ((ulong)(((uint)(uVar2 >> 4) & 1 ^ uVar5) & ((uint)(uVar1 >> 4) & 1 ^ uVar4)) & 1) << 4;
    }
  }
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vCos), local_2c < iVar3; local_2c = local_2c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pAVar8 = Aig_ObjFanin0(pAVar6);
    uVar2 = *(ulong *)&pAVar8->field_0x18;
    uVar5 = Aig_ObjFaninC0(pAVar6);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef |
         ((ulong)((uint)(uVar2 >> 4) & 1 ^ uVar5) & 1) << 4;
  }
  for (local_2c = 0; iVar3 = Vec_PtrSize(p->vCos), local_2c < iVar3; local_2c = local_2c + 1) {
    pvVar7 = Vec_PtrEntry(p->vCos,local_2c);
    if ((*(ulong *)((long)pvVar7 + 0x18) >> 4 & 1) != 0) {
      if (local_30 == -1) {
        local_30 = local_2c;
      }
      *pnOutputs = *pnOutputs + 1;
    }
  }
  Aig_ManCleanMarkA(p);
  return local_30;
}

Assistant:

int Ssw_SecCexResimulate( Aig_Man_t * p, int * pModel, int * pnOutputs )
{
    Aig_Obj_t * pObj;
    int i, RetValue = -1;
    *pnOutputs = 0;
    Aig_ManConst1(p)->fMarkA = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = pModel[i];
    Aig_ManForEachNode( p, pObj, i )
        pObj->fMarkA = ( Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj) ) & 
                      ( Aig_ObjFanin1(pObj)->fMarkA ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj);
    Aig_ManForEachCo( p, pObj, i )
        if ( pObj->fMarkA )
        {
            if ( RetValue == -1 )
                RetValue = i;
            (*pnOutputs)++;
        }
    Aig_ManCleanMarkA(p);
    return RetValue;
}